

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O2

bool_t DataToString(tchar_t *Value,size_t ValueLen,void *Data,size_t Size,dataflags Type)

{
  size_t sVar1;
  int Percent;
  ulong uVar2;
  size_t sVar3;
  uint p;
  int64_t p_00;
  int Decimal;
  uint uVar4;
  node *p_01;
  cc_fraction f;
  
  if (Size == 0) {
    Size = NodeTypeSize(Type);
  }
  uVar4 = (uint)Type;
  if ((uVar4 >> 8 & 1) != 0) {
    if ((uVar4 & 0x3f) == 4) {
      if (*Data == '\0') {
        return 0;
      }
      *Value = '\0';
      goto switchD_00122689_caseD_4;
    }
    sVar3 = 0;
    while( true ) {
      if (Size == sVar3) {
        return 0;
      }
      if (*(char *)((long)Data + sVar3) != '\0') break;
      sVar3 = sVar3 + 1;
    }
    if (Size == sVar3) {
      return 0;
    }
  }
  *Value = '\0';
  switch(uVar4 & 0x3f) {
  case 1:
  case 0x18:
    p = *Data;
    goto LAB_00122704;
  case 2:
    p = *Data;
    f.Num = (int_fast32_t)(int)p;
    if ((uVar4 & 0x1f000000) == 0xf000000) {
      Data = &f;
      f.Den = 0x400;
      Percent = -1;
      Decimal = 1;
      goto LAB_00122881;
    }
    goto LAB_00122704;
  case 3:
    if ((uVar4 & 0x1f000000) != 0xf000000) {
      stprintf_s(Value,ValueLen,"%d:%d",*Data,*(undefined8 *)((long)Data + 8));
      return 1;
    }
    Percent = -1;
    Decimal = 2;
    goto LAB_00122881;
  case 4:
switchD_00122689_caseD_4:
    tcscpy_s(Value,ValueLen,(tchar_t *)Data);
    return 1;
  case 5:
    stprintf_s(Value,ValueLen,"%d,%d,%d,%d",(ulong)*Data,(ulong)*(uint *)((long)Data + 4),
               (ulong)*(uint *)((long)Data + 8),*(undefined4 *)((long)Data + 0xc));
    break;
  case 6:
    stprintf_s(Value,ValueLen,"%d,%d",(ulong)*Data,(ulong)*(uint *)((long)Data + 4));
    break;
  case 7:
    RGBToString(Value,ValueLen,*Data);
    break;
  case 8:
    FourCCToString(Value,ValueLen,*Data);
    break;
  case 10:
    NodeToString(Value,ValueLen,*Data);
    break;
  case 0x10:
    for (sVar3 = 0; Size != sVar3; sVar3 = sVar3 + 1) {
      stcatprintf_s(Value,ValueLen,"%02X",(ulong)*(byte *)((long)Data + sVar3));
    }
    break;
  case 0x12:
    p = (uint)*Data;
    goto LAB_00122704;
  case 0x13:
    p = (uint)*Data;
LAB_00122704:
    uVar2 = 0;
LAB_00122706:
    IntToString(Value,ValueLen,p,uVar2);
    break;
  case 0x14:
  case 0x21:
  case 0x22:
    p = *Data;
    uVar2 = (ulong)((uVar4 & 0x1f000000) == 0x10000000);
    goto LAB_00122706;
  case 0x15:
    p_00 = *Data;
    uVar2 = (ulong)((uVar4 & 0x1f000000) == 0x10000000);
    goto LAB_001228e3;
  case 0x19:
    NodeToString(Value,ValueLen,*Data);
    p_01 = *Data;
    if (p_01 != (node *)0x0) {
      if (*Value != '\0') {
        tcscat_s(Value,ValueLen,".");
        p_01 = *Data;
      }
      sVar1 = strlen(Value);
      NodeParamName(p_01,*(dataid *)((long)Data + 8),Value + sVar1,ValueLen - sVar1);
    }
    break;
  case 0x23:
    GUIDToString(Value,ValueLen,(cc_guid *)Data);
    break;
  case 0x24:
    f.Num = (int_fast32_t)*Data;
    Data = &f;
    f.Den = 0x10000;
    Decimal = 3;
    Percent = 0;
LAB_00122881:
    FractionToString(Value,ValueLen,(cc_fraction *)Data,Percent,Decimal);
    break;
  case 0x29:
    p_00 = *Data;
    uVar2 = 0;
LAB_001228e3:
    Int64ToString(Value,ValueLen,p_00,uVar2);
  }
  return 1;
}

Assistant:

NOINLINE bool_t DataToString(tchar_t* Value, size_t ValueLen, const void* Data, size_t Size, dataflags Type)
{
    cc_fraction f;
    size_t i;

    if (!Size)
        Size = NodeTypeSize(Type);

    if (Type & TFLAG_DEFAULT)
    {
        if ((Type & TYPE_MASK) == TYPE_STRING)
        {
            if (((const tchar_t*)Data)[0]==0)
                return 0;
        }
        else
        {
            for (i=0;i<Size;++i)
                if (((const uint8_t*)Data)[i])
                    break;
            if (i==Size)
                return 0;
        }
    }

    Value[0] = 0;

    switch (Type & TYPE_MASK)
    {
    case TYPE_BINARY:
           for (i=0;i<Size;++i)
            stcatprintf_s(Value,ValueLen,T("%02X"),((uint8_t*)Data)[i]);
        break;

    case TYPE_RGB:
        RGBToString(Value,ValueLen,*(rgbval_t*)Data);
        break;

    case TYPE_SIZE:
#if SIZE_MAX > INT32_MAX
        Int64ToString(Value,ValueLen,*(size_t*)Data,0);
#else
        IntToString(Value,ValueLen,*(size_t*)Data,0);
#endif
        break;

    case TYPE_INT:
        if ((Type & TUNIT_MASK)==TUNIT_PERCENT)
        {
            f.Num = *(int*)Data;
            f.Den = PERCENT_ONE;
            FractionToString(Value,ValueLen,&f,-1,1);
        }
        else
        {
            IntToString(Value,ValueLen,*(int*)Data,0);
        }
        break;

    case TYPE_INT8:
        IntToString(Value,ValueLen,*(uint8_t*)Data,0);
        break;

    case TYPE_INT16:
        IntToString(Value,ValueLen,*(int16_t*)Data,0);
        break;

    case TYPE_GUID:
        GUIDToString(Value,ValueLen,(const cc_guid*)Data);
        break;

    case TYPE_DBNO: //TODO: support for 64 bits
    case TYPE_DATETIME:
    case TYPE_INT32:
        IntToString(Value,ValueLen,*(int32_t*)Data,(Type & TUNIT_MASK)==TUNIT_HEX);
        break;

    case TYPE_INT64:
        Int64ToString(Value,ValueLen,*(int64_t*)Data,(Type & TUNIT_MASK)==TUNIT_HEX);
        break;

    case TYPE_BOOL_BIT:
    case TYPE_BOOLEAN:
        IntToString(Value,ValueLen,(int32_t)*(bool_t*)Data,0);
        break;

    case TYPE_FOURCC:
        FourCCToString(Value,ValueLen,*(fourcc_t*)Data);
        break;

    case TYPE_POINT:
        stprintf_s(Value,ValueLen,T("%d,%d"),((cc_point*)Data)->x,((cc_point*)Data)->y);
        break;

    case TYPE_RECT:
        stprintf_s(Value,ValueLen,T("%d,%d,%d,%d"),((cc_rect*)Data)->x,((cc_rect*)Data)->y,((cc_rect*)Data)->Width,((cc_rect*)Data)->Height);
        break;

    case TYPE_FIX16:
        f.Num = *(int*)Data;
        f.Den = FIX16_UNIT;
        FractionToString(Value,ValueLen,&f,0,3);
        break;

    case TYPE_FRACTION:
        if ((Type & TUNIT_MASK)==TUNIT_PERCENT)
            FractionToString(Value,ValueLen,(cc_fraction*)Data,-1,2);
        else
            stprintf_s(Value,ValueLen,T("%d:%d"),((cc_fraction*)Data)->Num,((cc_fraction*)Data)->Den);
        break;

    case TYPE_PIN:
        PinToString(Value,ValueLen,(pin*)Data);
        break;

    case TYPE_NODE:
        NodeToString(Value,ValueLen,*(node**)Data);
        break;

    case TYPE_STRING:
        tcscpy_s(Value,ValueLen,(tchar_t*)Data);
        break;
    }

    return 1;
}